

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreDataAlignmentTest::BindTextureToImage
          (ImageLoadStoreDataAlignmentTest *this,GLuint program_id,GLuint texture_id,
          GLuint image_unit,char *uniform_name)

{
  GLint location;
  GLenum GVar1;
  InternalError *this_00;
  CallLogWrapper *this_01;
  
  this_01 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  location = glu::CallLogWrapper::glGetUniformLocation(this_01,program_id,uniform_name);
  GVar1 = glu::CallLogWrapper::glGetError(this_01);
  glu::checkError(GVar1,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x1ac3);
  if (location != -1) {
    glu::CallLogWrapper::glBindImageTexture(this_01,image_unit,texture_id,0,'\0',0,0x88ba,0x8232);
    GVar1 = glu::CallLogWrapper::glGetError(this_01);
    glu::checkError(GVar1,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1acb);
    glu::CallLogWrapper::glUniform1i(this_01,location,image_unit);
    GVar1 = glu::CallLogWrapper::glGetError(this_01);
    glu::checkError(GVar1,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                    ,0x1acf);
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this_00,"A required uniform is considered inactive",uniform_name,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
             ,0x1ac6);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindTextureToImage(GLuint program_id, GLuint texture_id, GLuint image_unit, const char* uniform_name)
	{
		/* Uniform location and invalid value */
		static const GLint invalid_uniform_location = -1;
		GLint			   image_uniform_location   = 0;

		/* Get uniform location */
		image_uniform_location = glGetUniformLocation(program_id, uniform_name);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetUniformLocation");
		if (invalid_uniform_location == image_uniform_location)
		{
			throw tcu::InternalError("A required uniform is considered inactive", uniform_name, __FILE__, __LINE__);
		}

		/* Bind texture to image unit */
		glBindImageTexture(image_unit, texture_id, 0 /* level */, GL_FALSE, 0 /* layer */, GL_READ_WRITE, GL_R8UI);
		GLU_EXPECT_NO_ERROR(glGetError(), "BindImageTexture");

		/* Set uniform to image unit */
		glUniform1i(image_uniform_location, image_unit);
		GLU_EXPECT_NO_ERROR(glGetError(), "Uniform1i");
	}